

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fake_network.cxx
# Opt level: O3

bool __thiscall
nuraft::FakeNetwork::delieverReqTo(FakeNetwork *this,string *endpoint,bool random_order)

{
  list<nuraft::FakeNetwork::ReqPkg,_std::allocator<nuraft::FakeNetwork::ReqPkg>_> *plVar1;
  size_t *psVar2;
  iterator __position;
  SimpleLogger *this_00;
  pointer pcVar3;
  pointer pcVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  bool bVar6;
  _List_node_base *p_Var7;
  FakeNetwork *msg;
  ptr<FakeClient> pVar8;
  ptr<resp_msg> pVar9;
  RespPkg local_98;
  pointer local_68;
  pointer local_60;
  list<nuraft::FakeNetwork::ReqPkg,_std::allocator<nuraft::FakeNetwork::ReqPkg>_> *local_58;
  ptr<resp_msg> resp;
  ptr<FakeClient> conn;
  
  pVar8 = findClient((FakeNetwork *)&conn,(string *)this);
  msg = (conn.super___shared_ptr<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->dstNet;
  if ((msg == (FakeNetwork *)0x0) || (msg->online == false)) {
    bVar6 = makeReqFail(this,endpoint,false);
  }
  else {
    plVar1 = &(conn.super___shared_ptr<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              pendingReqs;
    __position._M_node =
         ((conn.super___shared_ptr<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         pendingReqs).
         super__List_base<nuraft::FakeNetwork::ReqPkg,_std::allocator<nuraft::FakeNetwork::ReqPkg>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    if (__position._M_node == (_List_node_base *)plVar1) {
      bVar6 = false;
    }
    else {
      this_00 = ((this->base).
                 super___shared_ptr<nuraft::FakeNetworkBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                myLog;
      local_58 = plVar1;
      if ((this_00 != (SimpleLogger *)0x0) &&
         (3 < (this_00->curLogLevel).super___atomic_base<int>._M_i)) {
        local_60 = (this->myEndpoint)._M_dataplus._M_p;
        local_68 = (endpoint->_M_dataplus)._M_p;
        msg_type_to_string_abi_cxx11_
                  ((string *)&local_98,
                   (nuraft *)(ulong)*(uint *)&__position._M_node[1]._M_next[1]._M_next,
                   (msg_type)
                   pVar8.super___shared_ptr<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        SimpleLogger::put(this_00,4,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/fake_network.cxx"
                          ,"delieverReqTo",0xa7,"[BEGIN] send/process %s -> %s, %s",local_60,
                          local_68,local_98.resp.
                                   super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr);
        if (local_98.resp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)&local_98.whenDone) {
          operator_delete(local_98.resp.
                          super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
        msg = (conn.super___shared_ptr<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              dstNet;
      }
      pVar9 = gotMsg((FakeNetwork *)&resp,(ptr<req_msg> *)msg);
      if ((this_00 != (SimpleLogger *)0x0) &&
         (3 < (this_00->curLogLevel).super___atomic_base<int>._M_i)) {
        pcVar3 = (this->myEndpoint)._M_dataplus._M_p;
        pcVar4 = (endpoint->_M_dataplus)._M_p;
        msg_type_to_string_abi_cxx11_
                  ((string *)&local_98,
                   (nuraft *)(ulong)*(uint *)&__position._M_node[1]._M_next[1]._M_next,
                   (msg_type)
                   pVar9.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        SimpleLogger::put(this_00,4,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/fake_network.cxx"
                          ,"delieverReqTo",0xac,"[END] send/process %s -> %s, %s",pcVar3,pcVar4,
                          local_98.resp.
                          super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        if (local_98.resp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)&local_98.whenDone) {
          operator_delete(local_98.resp.
                          super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
      }
      RespPkg::RespPkg(&local_98,&resp,(rpc_handler *)(__position._M_node + 2));
      p_Var7 = (_List_node_base *)operator_new(0x40);
      _Var5._M_pi = local_98.resp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      local_98.resp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var7[1]._M_next =
           (_List_node_base *)
           local_98.resp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var7[1]._M_prev = (_List_node_base *)_Var5._M_pi;
      local_98.resp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      p_Var7[3]._M_next = (_List_node_base *)0x0;
      p_Var7[2]._M_next = (_List_node_base *)0x0;
      p_Var7[2]._M_prev = (_List_node_base *)0x0;
      p_Var7[3]._M_prev = (_List_node_base *)local_98.whenDone._M_invoker;
      if ((_List_node_base *)local_98.whenDone.super__Function_base._M_manager !=
          (_List_node_base *)0x0) {
        p_Var7[2]._M_next =
             (_List_node_base *)local_98.whenDone.super__Function_base._M_functor._M_unused._0_8_;
        p_Var7[2]._M_prev =
             (_List_node_base *)local_98.whenDone.super__Function_base._M_functor._8_8_;
        p_Var7[3]._M_next = (_List_node_base *)local_98.whenDone.super__Function_base._M_manager;
        local_98.whenDone.super__Function_base._M_manager = (_Manager_type)0x0;
        local_98.whenDone._M_invoker = (_Invoker_type)0x0;
      }
      std::__detail::_List_node_base::_M_hook(p_Var7);
      psVar2 = &((conn.super___shared_ptr<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                pendingResps).
                super__List_base<nuraft::FakeNetwork::RespPkg,_std::allocator<nuraft::FakeNetwork::RespPkg>_>
                ._M_impl._M_node._M_size;
      *psVar2 = *psVar2 + 1;
      if ((_List_node_base *)local_98.whenDone.super__Function_base._M_manager !=
          (_List_node_base *)0x0) {
        (*local_98.whenDone.super__Function_base._M_manager)
                  ((_Any_data *)&local_98.whenDone,(_Any_data *)&local_98.whenDone,__destroy_functor
                  );
      }
      if (local_98.resp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_98.resp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      std::__cxx11::list<nuraft::FakeNetwork::ReqPkg,_std::allocator<nuraft::FakeNetwork::ReqPkg>_>
      ::_M_erase(local_58,__position);
      if (resp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (resp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      bVar6 = true;
    }
  }
  if (conn.super___shared_ptr<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (conn.super___shared_ptr<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return bVar6;
}

Assistant:

bool FakeNetwork::delieverReqTo(const std::string& endpoint,
                                bool random_order)
{
    // this:                    source (sending request)
    // conn->dstNet (endpoint): destination (sending response)
    ptr<FakeClient> conn = findClient(endpoint);

    // If destination is offline, make failure.
    if (!conn->isDstOnline()) return makeReqFail(endpoint, random_order);

    auto pkg_entry = conn->pendingReqs.begin();
    if (pkg_entry == conn->pendingReqs.end()) return false;

    ReqPkg& pkg = *pkg_entry;

    SimpleLogger* ll = base->getLogger();
    _log_info(ll, "[BEGIN] send/process %s -> %s, %s",
              myEndpoint.c_str(), endpoint.c_str(),
              msg_type_to_string( pkg.req->get_type() ).c_str() );

    ptr<resp_msg> resp = conn->dstNet->gotMsg( pkg.req );
    _log_info(ll, "[END] send/process %s -> %s, %s",
              myEndpoint.c_str(), endpoint.c_str(),
              msg_type_to_string( pkg.req->get_type() ).c_str() );

    conn->pendingResps.push_back( FakeNetwork::RespPkg(resp, pkg.whenDone) );
    conn->pendingReqs.erase(pkg_entry);
    return true;
}